

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

UInt32 MatchFinder_GetHashMask2(CMatchFinder *p,UInt32 hs)

{
  uint uVar1;
  uint local_1c;
  UInt32 hs_local;
  CMatchFinder *p_local;
  
  if (p->numHashBytes == 2) {
    p_local._4_4_ = 0xffff;
  }
  else {
    local_1c = hs;
    if (hs != 0) {
      local_1c = hs - 1;
    }
    uVar1 = local_1c >> 1 | local_1c;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    local_1c = uVar1 >> 8 | uVar1;
    if ((0xffffff < local_1c) && (p->numHashBytes == 3)) {
      local_1c = 0xffffff;
    }
    uVar1 = local_1c | 0xffff;
    if (4 < p->numHashBytes) {
      uVar1 = local_1c | 0x3ffff;
    }
    local_1c = uVar1;
    p_local._4_4_ = local_1c;
  }
  return p_local._4_4_;
}

Assistant:

static UInt32 MatchFinder_GetHashMask2(CMatchFinder *p, UInt32 hs)
{
  if (p->numHashBytes == 2)
    return (1 << 16) - 1;
  if (hs != 0)
    hs--;
  hs |= (hs >> 1);
  hs |= (hs >> 2);
  hs |= (hs >> 4);
  hs |= (hs >> 8);
  // we propagated 16 bits in (hs). Low 16 bits must be set later
  if (hs >= (1 << 24))
  {
    if (p->numHashBytes == 3)
      hs = (1 << 24) - 1;
    /* if (bigHash) mode, GetHeads4b() in LzFindMt.c needs (hs >= ((1 << 24) - 1))) */
  }
  // (hash_size >= (1 << 16)) : Required for (numHashBytes > 2)
  hs |= (1 << 16) - 1; /* don't change it! */
  // bt5: we adjust the size with recommended minimum size
  if (p->numHashBytes >= 5)
    hs |= (256 << kLzHash_CrcShift_2) - 1;
  return hs;
}